

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::FieldBase::FieldBase(FieldBase *this,FieldBase *rhs)

{
  int iVar1;
  FieldBase *rhs_local;
  FieldBase *this_local;
  
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_0032f310;
  iVar1 = getTag(rhs);
  this->m_tag = iVar1;
  std::__cxx11::string::string((string *)&this->m_string,(string *)&rhs->m_string);
  std::__cxx11::string::string((string *)&this->m_data);
  this->m_metrics = rhs->m_metrics;
  return;
}

Assistant:

FieldBase(const FieldBase &rhs)
      : m_tag(rhs.getTag()),
        m_string(rhs.m_string),
        m_metrics(rhs.m_metrics) {}